

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O0

bool __thiscall crunch::process_files(crunch *this,file_desc_vec *files)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char c;
  uint uVar4;
  format fVar5;
  uint uVar6;
  file_desc *this_00;
  char *pcVar7;
  ssize_t sVar8;
  char *pcVar9;
  dynamic_string *pdVar10;
  char *pcVar11;
  char *pcVar12;
  size_t __nbytes;
  convert_status local_1cc;
  undefined1 local_1c8 [4];
  convert_status status;
  undefined1 local_1b8 [8];
  dynamic_string out_path;
  dynamic_string out_drive_1;
  dynamic_string out_dir_1;
  dynamic_string out_ext;
  dynamic_string out_name;
  dynamic_string out_dir;
  dynamic_string out_drive;
  dynamic_string out_filename;
  crn_header in_header;
  cfile_stream in_stream;
  format input_file_type;
  dynamic_string fmt;
  undefined1 local_88 [4];
  format out_file_type;
  dynamic_string in_ext;
  dynamic_string in_fname;
  undefined1 local_58 [8];
  dynamic_string in_path;
  dynamic_string in_drive;
  dynamic_string *in_filename;
  file_desc *file_desc;
  uint32 file_index;
  bool info_mode;
  bool compare_mode;
  file_desc_vec *files_local;
  crunch *this_local;
  
  bVar1 = crnlib::command_line_params::get_value_as_bool(&this->m_params,"compare",0,false);
  bVar2 = crnlib::command_line_params::get_value_as_bool(&this->m_params,"info",0,false);
  for (file_desc._0_4_ = 0; uVar4 = crnlib::vector<crnlib::find_files::file_desc>::size(files),
      (uint)file_desc < uVar4; file_desc._0_4_ = (uint)file_desc + 1) {
    this_00 = crnlib::vector<crnlib::find_files::file_desc>::operator[](files,(uint)file_desc);
    crnlib::dynamic_string::dynamic_string((dynamic_string *)&in_path.m_pStr);
    crnlib::dynamic_string::dynamic_string((dynamic_string *)local_58);
    crnlib::dynamic_string::dynamic_string((dynamic_string *)&in_ext.m_pStr);
    crnlib::dynamic_string::dynamic_string((dynamic_string *)local_88);
    pcVar7 = crnlib::dynamic_string::get_ptr(&this_00->m_fullname);
    crnlib::file_utils::split_path
              (pcVar7,(dynamic_string *)&in_path.m_pStr,(dynamic_string *)local_58,
               (dynamic_string *)&in_ext.m_pStr,(dynamic_string *)local_88);
    fmt.m_pStr._4_4_ = cFormatCRN;
    crnlib::dynamic_string::dynamic_string((dynamic_string *)&input_file_type);
    bVar3 = crnlib::command_line_params::get_value_as_string
                      (&this->m_params,"fileformat",0,(dynamic_string *)&input_file_type,0);
    if (bVar3) {
      bVar3 = crnlib::dynamic_string::operator==((dynamic_string *)&input_file_type,"tga");
      if (bVar3) {
        fmt.m_pStr._4_4_ = cFormatTGA;
        goto LAB_00110c59;
      }
      bVar3 = crnlib::dynamic_string::operator==((dynamic_string *)&input_file_type,"bmp");
      if (bVar3) {
        fmt.m_pStr._4_4_ = cFormatBMP;
        goto LAB_00110c59;
      }
      bVar3 = crnlib::dynamic_string::operator==((dynamic_string *)&input_file_type,"dds");
      if (bVar3) {
        fmt.m_pStr._4_4_ = cFormatDDS;
        goto LAB_00110c59;
      }
      bVar3 = crnlib::dynamic_string::operator==((dynamic_string *)&input_file_type,"ktx");
      if (bVar3) {
        fmt.m_pStr._4_4_ = cFormatKTX;
        goto LAB_00110c59;
      }
      bVar3 = crnlib::dynamic_string::operator==((dynamic_string *)&input_file_type,"crn");
      if (bVar3) {
        fmt.m_pStr._4_4_ = cFormatCRN;
        goto LAB_00110c59;
      }
      bVar3 = crnlib::dynamic_string::operator==((dynamic_string *)&input_file_type,"png");
      if (bVar3) {
        fmt.m_pStr._4_4_ = cFormatPNG;
        goto LAB_00110c59;
      }
      pcVar7 = crnlib::dynamic_string::get_ptr((dynamic_string *)&input_file_type);
      crnlib::console::error("Unsupported output file type: %s",pcVar7);
      this_local._7_1_ = 0;
      in_stream._60_4_ = 1;
    }
    else {
LAB_00110c59:
      bVar3 = crnlib::command_line_params::has_key(&this->m_params,"fileformat");
      if (!bVar3) {
        bVar3 = crnlib::command_line_params::has_key(&this->m_params,"split");
        if (bVar3) {
          fmt.m_pStr._4_4_ = cFormatPNG;
        }
        else {
          pcVar7 = crnlib::dynamic_string::get_ptr(&this_00->m_fullname);
          fVar5 = crnlib::texture_file_types::determine_file_format(pcVar7);
          if (fVar5 == cFormatCRN) {
            fmt.m_pStr._4_4_ = cFormatDDS;
            crnlib::cfile_stream::cfile_stream((cfile_stream *)(in_header.m_tables_size.m_buf + 1));
            crnd::crn_header::crn_header((crn_header *)((long)&out_filename.m_pStr + 6));
            pcVar7 = crnlib::dynamic_string::get_ptr(&this_00->m_fullname);
            __nbytes = 0;
            uVar6 = crnlib::cfile_stream::open
                              ((cfile_stream *)(in_header.m_tables_size.m_buf + 1),pcVar7,5);
            if ((((uVar6 & 1) != 0) &&
                (sVar8 = crnlib::cfile_stream::read
                                   ((cfile_stream *)(in_header.m_tables_size.m_buf + 1),
                                    (int)&out_filename + 0xe,(void *)0x4a,__nbytes),
                (int)sVar8 == 0x4a)) &&
               ((uVar6 = crnd::crn_packed_uint::operator_cast_to_unsigned_int
                                   ((crn_packed_uint *)&in_header.m_data_crc16), uVar6 == 10 ||
                ((((uVar6 = crnd::crn_packed_uint::operator_cast_to_unsigned_int
                                      ((crn_packed_uint *)&in_header.m_data_crc16), uVar6 == 0xb ||
                   (uVar6 = crnd::crn_packed_uint::operator_cast_to_unsigned_int
                                      ((crn_packed_uint *)&in_header.m_data_crc16), uVar6 == 0xc))
                  || (uVar6 = crnd::crn_packed_uint::operator_cast_to_unsigned_int
                                        ((crn_packed_uint *)&in_header.m_data_crc16), uVar6 == 0xd))
                 || (uVar6 = crnd::crn_packed_uint::operator_cast_to_unsigned_int
                                       ((crn_packed_uint *)&in_header.m_data_crc16), uVar6 == 0xe)))
                ))) {
              fmt.m_pStr._4_4_ = cFormatKTX;
            }
            crnlib::cfile_stream::~cfile_stream((cfile_stream *)(in_header.m_tables_size.m_buf + 1))
            ;
          }
          else if (fVar5 == cFormatKTX) {
            fmt.m_pStr._4_4_ = cFormatPNG;
          }
        }
      }
      crnlib::dynamic_string::dynamic_string((dynamic_string *)&out_drive.m_pStr);
      bVar3 = crnlib::command_line_params::get_value_as_bool(&this->m_params,"outsamedir",0,false);
      if (bVar3) {
        pcVar7 = crnlib::dynamic_string::get_ptr((dynamic_string *)&in_path.m_pStr);
        pcVar11 = crnlib::dynamic_string::get_ptr((dynamic_string *)local_58);
        pcVar12 = crnlib::dynamic_string::get_ptr((dynamic_string *)&in_ext.m_pStr);
        pcVar9 = crnlib::texture_file_types::get_extension(fmt.m_pStr._4_4_);
        crnlib::dynamic_string::format
                  ((dynamic_string *)&out_drive.m_pStr,"%s%s%s.%s",pcVar7,pcVar11,pcVar12,pcVar9);
      }
      else {
        bVar3 = crnlib::command_line_params::has_key(&this->m_params,"out");
        if (bVar3) {
          pdVar10 = crnlib::command_line_params::get_value_as_string_or_empty
                              (&this->m_params,"out",0,0);
          crnlib::dynamic_string::operator=((dynamic_string *)&out_drive.m_pStr,pdVar10);
          uVar4 = crnlib::vector<crnlib::find_files::file_desc>::size(files);
          if (1 < uVar4) {
            crnlib::dynamic_string::dynamic_string((dynamic_string *)&out_dir.m_pStr);
            crnlib::dynamic_string::dynamic_string((dynamic_string *)&out_name.m_pStr);
            crnlib::dynamic_string::dynamic_string((dynamic_string *)&out_ext.m_pStr);
            crnlib::dynamic_string::dynamic_string((dynamic_string *)&out_dir_1.m_pStr);
            pcVar7 = crnlib::dynamic_string::get_ptr((dynamic_string *)&out_drive.m_pStr);
            crnlib::file_utils::split_path
                      (pcVar7,(dynamic_string *)&out_dir.m_pStr,(dynamic_string *)&out_name.m_pStr,
                       (dynamic_string *)&out_ext.m_pStr,(dynamic_string *)&out_dir_1.m_pStr);
            pcVar7 = crnlib::dynamic_string::get_ptr((dynamic_string *)&out_ext.m_pStr);
            crnlib::dynamic_string::format
                      ((dynamic_string *)&out_ext.m_pStr,"%s_%u",pcVar7,(ulong)(uint)file_desc);
            pcVar7 = crnlib::dynamic_string::get_ptr((dynamic_string *)&out_dir.m_pStr);
            pcVar11 = crnlib::dynamic_string::get_ptr((dynamic_string *)&out_name.m_pStr);
            pcVar12 = crnlib::dynamic_string::get_ptr((dynamic_string *)&out_ext.m_pStr);
            pcVar9 = crnlib::dynamic_string::get_ptr((dynamic_string *)&out_dir_1.m_pStr);
            crnlib::dynamic_string::format
                      ((dynamic_string *)&out_drive.m_pStr,"%s%s%s%s",pcVar7,pcVar11,pcVar12,pcVar9)
            ;
            crnlib::dynamic_string::~dynamic_string((dynamic_string *)&out_dir_1.m_pStr);
            crnlib::dynamic_string::~dynamic_string((dynamic_string *)&out_ext.m_pStr);
            crnlib::dynamic_string::~dynamic_string((dynamic_string *)&out_name.m_pStr);
            crnlib::dynamic_string::~dynamic_string((dynamic_string *)&out_dir.m_pStr);
          }
          bVar3 = crnlib::command_line_params::has_key(&this->m_params,"fileformat");
          if (!bVar3) {
            pcVar7 = crnlib::dynamic_string::get_ptr((dynamic_string *)&out_drive.m_pStr);
            fmt.m_pStr._4_4_ = crnlib::texture_file_types::determine_file_format(pcVar7);
          }
        }
        else {
          pdVar10 = crnlib::command_line_params::get_value_as_string_or_empty
                              (&this->m_params,"outdir",0,0);
          crnlib::dynamic_string::dynamic_string((dynamic_string *)&out_drive_1.m_pStr,pdVar10);
          bVar3 = crnlib::command_line_params::get_value_as_bool(&this->m_params,"recreate",0,false)
          ;
          if ((bVar3) && (uVar4 = crnlib::dynamic_string::get_len(&this_00->m_rel), uVar4 != 0)) {
            pcVar7 = crnlib::dynamic_string::get_ptr((dynamic_string *)&out_drive_1.m_pStr);
            pcVar11 = crnlib::dynamic_string::get_ptr(&this_00->m_rel);
            crnlib::file_utils::combine_path((dynamic_string *)&out_drive_1.m_pStr,pcVar7,pcVar11);
          }
          uVar4 = crnlib::dynamic_string::get_len((dynamic_string *)&out_drive_1.m_pStr);
          if (uVar4 == 0) {
            pcVar7 = crnlib::dynamic_string::get_ptr((dynamic_string *)&in_ext.m_pStr);
            crnlib::texture_file_types::get_extension(fmt.m_pStr._4_4_);
            crnlib::dynamic_string::format((dynamic_string *)&out_drive.m_pStr,"%s.%s",pcVar7);
          }
          else {
            c = crnlib::dynamic_string::back((dynamic_string *)&out_drive_1.m_pStr);
            bVar3 = crnlib::file_utils::is_path_separator(c);
            if (bVar3) {
              pcVar7 = crnlib::dynamic_string::get_ptr((dynamic_string *)&out_drive_1.m_pStr);
              pcVar11 = crnlib::dynamic_string::get_ptr((dynamic_string *)&in_ext.m_pStr);
              pcVar12 = crnlib::texture_file_types::get_extension(fmt.m_pStr._4_4_);
              crnlib::dynamic_string::format
                        ((dynamic_string *)&out_drive.m_pStr,"%s%s.%s",pcVar7,pcVar11,pcVar12);
            }
            else {
              pcVar7 = crnlib::dynamic_string::get_ptr((dynamic_string *)&out_drive_1.m_pStr);
              pcVar11 = crnlib::dynamic_string::get_ptr((dynamic_string *)&in_ext.m_pStr);
              pcVar12 = crnlib::texture_file_types::get_extension(fmt.m_pStr._4_4_);
              crnlib::dynamic_string::format
                        ((dynamic_string *)&out_drive.m_pStr,"%s\\%s.%s",pcVar7,pcVar11,pcVar12);
            }
          }
          bVar3 = crnlib::command_line_params::get_value_as_bool(&this->m_params,"recreate",0,false)
          ;
          if (((bVar3) &&
              (bVar3 = crnlib::file_utils::full_path((dynamic_string *)&out_drive.m_pStr), bVar3))
             && ((!bVar1 && (!bVar2)))) {
            crnlib::dynamic_string::dynamic_string((dynamic_string *)&out_path.m_pStr);
            crnlib::dynamic_string::dynamic_string((dynamic_string *)local_1b8);
            pcVar7 = crnlib::dynamic_string::get_ptr((dynamic_string *)&out_drive.m_pStr);
            crnlib::file_utils::split_path
                      (pcVar7,(dynamic_string *)&out_path.m_pStr,(dynamic_string *)local_1b8,
                       (dynamic_string *)0x0,(dynamic_string *)0x0);
            crnlib::dynamic_string::operator+=
                      ((dynamic_string *)&out_path.m_pStr,(dynamic_string *)local_1b8);
            pcVar7 = crnlib::dynamic_string::get_ptr((dynamic_string *)&out_path.m_pStr);
            crnlib::dynamic_string::dynamic_string((dynamic_string *)local_1c8,pcVar7);
            crnlib::file_utils::create_path((dynamic_string *)local_1c8);
            crnlib::dynamic_string::~dynamic_string((dynamic_string *)local_1c8);
            crnlib::dynamic_string::~dynamic_string((dynamic_string *)local_1b8);
            crnlib::dynamic_string::~dynamic_string((dynamic_string *)&out_path.m_pStr);
          }
          crnlib::dynamic_string::~dynamic_string((dynamic_string *)&out_drive_1.m_pStr);
        }
      }
      if ((!bVar1) && (!bVar2)) {
        pcVar7 = crnlib::dynamic_string::get_ptr((dynamic_string *)&out_drive.m_pStr);
        bVar3 = crnlib::file_utils::does_file_exist(pcVar7);
        if (!bVar3) goto LAB_001116ed;
        bVar3 = crnlib::command_line_params::get_value_as_bool
                          (&this->m_params,"nooverwrite",0,false);
        if (!bVar3) {
          bVar3 = crnlib::command_line_params::get_value_as_bool
                            (&this->m_params,"timestamp",0,false);
          if (bVar3) {
            pcVar7 = crnlib::dynamic_string::get_ptr(&this_00->m_fullname);
            pcVar11 = crnlib::dynamic_string::get_ptr((dynamic_string *)&out_drive.m_pStr);
            bVar3 = crnlib::file_utils::is_older_than(pcVar7,pcVar11);
            if (bVar3) {
              pcVar7 = crnlib::dynamic_string::get_ptr((dynamic_string *)&out_drive.m_pStr);
              crnlib::console::warning("Skipping up to date file: %s\n",pcVar7);
              this->m_num_skipped = this->m_num_skipped + 1;
              in_stream._60_4_ = 4;
              goto LAB_00111974;
            }
          }
          goto LAB_001116ed;
        }
        pcVar7 = crnlib::dynamic_string::get_ptr((dynamic_string *)&out_drive.m_pStr);
        crnlib::console::warning("Skipping already existing file: %s\n",pcVar7);
        this->m_num_skipped = this->m_num_skipped + 1;
        in_stream._60_4_ = 4;
        goto LAB_00111974;
      }
LAB_001116ed:
      local_1cc = cCSFailed;
      if (bVar2) {
        uVar4 = crnlib::vector<crnlib::find_files::file_desc>::size(files);
        pcVar7 = crnlib::dynamic_string::get_ptr(&this_00->m_fullname);
        local_1cc = display_file_info(this,(uint)file_desc,uVar4,pcVar7);
      }
      else if (bVar1) {
        uVar4 = crnlib::vector<crnlib::find_files::file_desc>::size(files);
        pcVar7 = crnlib::dynamic_string::get_ptr(&this_00->m_fullname);
        pcVar11 = crnlib::dynamic_string::get_ptr((dynamic_string *)&out_drive.m_pStr);
        local_1cc = compare_file(this,(uint)file_desc,uVar4,pcVar7,pcVar11,fmt.m_pStr._4_4_);
      }
      else {
        pcVar7 = crnlib::dynamic_string::get_ptr((dynamic_string *)&out_drive.m_pStr);
        bVar3 = read_only_file_check(this,pcVar7);
        if (bVar3) {
          uVar4 = crnlib::vector<crnlib::find_files::file_desc>::size(files);
          pcVar7 = crnlib::dynamic_string::get_ptr(&this_00->m_fullname);
          pcVar11 = crnlib::dynamic_string::get_ptr((dynamic_string *)&out_drive.m_pStr);
          local_1cc = convert_file(this,(uint)file_desc,uVar4,pcVar7,pcVar11,fmt.m_pStr._4_4_);
        }
      }
      this->m_num_processed = this->m_num_processed + 1;
      if (local_1cc == cCSSucceeded) {
        crnlib::console::info("");
        this->m_num_succeeded = this->m_num_succeeded + 1;
LAB_0011196a:
        in_stream._60_4_ = 0;
      }
      else {
        if (local_1cc == cCSSkipped) {
          crnlib::console::info("Skipping file.\n");
          this->m_num_skipped = this->m_num_skipped + 1;
          goto LAB_0011196a;
        }
        if (local_1cc == cCSBadParam) {
          this_local._7_1_ = 0;
          in_stream._60_4_ = 1;
        }
        else {
          bVar3 = crnlib::command_line_params::get_value_as_bool
                            (&this->m_params,"ignoreerrors",0,false);
          if (bVar3) {
            crnlib::console::info("");
            this->m_num_failed = this->m_num_failed + 1;
            goto LAB_0011196a;
          }
          this_local._7_1_ = 0;
          in_stream._60_4_ = 1;
        }
      }
LAB_00111974:
      crnlib::dynamic_string::~dynamic_string((dynamic_string *)&out_drive.m_pStr);
    }
    crnlib::dynamic_string::~dynamic_string((dynamic_string *)&input_file_type);
    crnlib::dynamic_string::~dynamic_string((dynamic_string *)local_88);
    crnlib::dynamic_string::~dynamic_string((dynamic_string *)&in_ext.m_pStr);
    crnlib::dynamic_string::~dynamic_string((dynamic_string *)local_58);
    crnlib::dynamic_string::~dynamic_string((dynamic_string *)&in_path.m_pStr);
    if ((in_stream._60_4_ != 0) && (in_stream._60_4_ == 1)) goto LAB_00111a23;
  }
  this_local._7_1_ = 1;
LAB_00111a23:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool process_files(find_files::file_desc_vec& files)
    {
        const bool compare_mode = m_params.get_value_as_bool("compare");
        const bool info_mode = m_params.get_value_as_bool("info");

        for (uint32 file_index = 0; file_index < files.size(); file_index++)
        {
            const find_files::file_desc& file_desc = files[file_index];
            const dynamic_string& in_filename = file_desc.m_fullname;

            dynamic_string in_drive, in_path, in_fname, in_ext;
            file_utils::split_path(in_filename.get_ptr(), &in_drive, &in_path, &in_fname, &in_ext);

            texture_file_types::format out_file_type = texture_file_types::cFormatCRN;
            dynamic_string fmt;
            if (m_params.get_value_as_string("fileformat", 0, fmt))
            {
                if (fmt == "tga")
                {
                    out_file_type = texture_file_types::cFormatTGA;
                }
                else if (fmt == "bmp")
                {
                    out_file_type = texture_file_types::cFormatBMP;
                }
                else if (fmt == "dds")
                {
                    out_file_type = texture_file_types::cFormatDDS;
                }
                else if (fmt == "ktx")
                {
                    out_file_type = texture_file_types::cFormatKTX;
                }
                else if (fmt == "crn")
                {
                    out_file_type = texture_file_types::cFormatCRN;
                }
                else if (fmt == "png")
                {
                    out_file_type = texture_file_types::cFormatPNG;
                }
                else
                {
                    console::error("Unsupported output file type: %s", fmt.get_ptr());
                    return false;
                }
            }

            // No explicit output format has been specified - try to determine something doable.
            if (!m_params.has_key("fileformat"))
            {
                if (m_params.has_key("split"))
                {
                    out_file_type = texture_file_types::cFormatPNG;
                }
                else
                {
                    texture_file_types::format input_file_type = texture_file_types::determine_file_format(in_filename.get_ptr());
                    if (input_file_type == texture_file_types::cFormatCRN)
                    {
                        out_file_type = texture_file_types::cFormatDDS;
                        cfile_stream in_stream;
                        crnd::crn_header in_header;
                        if (in_stream.open(in_filename.get_ptr()) && in_stream.read(&in_header, sizeof(in_header)) == sizeof(in_header) &&
                            (in_header.m_format == cCRNFmtETC1 || in_header.m_format == cCRNFmtETC2 || in_header.m_format == cCRNFmtETC2A || in_header.m_format == cCRNFmtETC1S || in_header.m_format == cCRNFmtETC2AS))
                        {
                            out_file_type = texture_file_types::cFormatKTX;
                        }
                    }
                    else if (input_file_type == texture_file_types::cFormatKTX)
                    {
                        // Default to converting KTX files to PNG
                        out_file_type = texture_file_types::cFormatPNG;
                    }
                }
            }

            dynamic_string out_filename;
            if (m_params.get_value_as_bool("outsamedir"))
            {
                out_filename.format("%s%s%s.%s", in_drive.get_ptr(), in_path.get_ptr(), in_fname.get_ptr(), texture_file_types::get_extension(out_file_type));
            }
            else if (m_params.has_key("out"))
            {
                out_filename = m_params.get_value_as_string_or_empty("out");

                if (files.size() > 1)
                {
                    dynamic_string out_drive, out_dir, out_name, out_ext;
                    file_utils::split_path(out_filename.get_ptr(), &out_drive, &out_dir, &out_name, &out_ext);

                    out_name.format("%s_%u", out_name.get_ptr(), file_index);

                    out_filename.format("%s%s%s%s", out_drive.get_ptr(), out_dir.get_ptr(), out_name.get_ptr(), out_ext.get_ptr());
                }

                if (!m_params.has_key("fileformat"))
                {
                    out_file_type = texture_file_types::determine_file_format(out_filename.get_ptr());
                }
            }
            else
            {
                dynamic_string out_dir(m_params.get_value_as_string_or_empty("outdir"));

                if (m_params.get_value_as_bool("recreate") && file_desc.m_rel.get_len())
                {
                    file_utils::combine_path(out_dir, out_dir.get_ptr(), file_desc.m_rel.get_ptr());
                }

                if (out_dir.get_len())
                {
                    if (file_utils::is_path_separator(out_dir.back()))
                    {
                        out_filename.format("%s%s.%s", out_dir.get_ptr(), in_fname.get_ptr(), texture_file_types::get_extension(out_file_type));
                    }
                    else
                    {
                        out_filename.format("%s\\%s.%s", out_dir.get_ptr(), in_fname.get_ptr(), texture_file_types::get_extension(out_file_type));
                    }
                }
                else
                {
                    out_filename.format("%s.%s", in_fname.get_ptr(), texture_file_types::get_extension(out_file_type));
                }

                if (m_params.get_value_as_bool("recreate"))
                {
                    if (file_utils::full_path(out_filename))
                    {
                        if ((!compare_mode) && (!info_mode))
                        {
                            dynamic_string out_drive, out_path;
                            file_utils::split_path(out_filename.get_ptr(), &out_drive, &out_path, nullptr, nullptr);
                            out_drive += out_path;
                            file_utils::create_path(out_drive.get_ptr());
                        }
                    }
                }
            }

            if ((!compare_mode) && (!info_mode))
            {
                if (file_utils::does_file_exist(out_filename.get_ptr()))
                {
                    if (m_params.get_value_as_bool("nooverwrite"))
                    {
                        console::warning("Skipping already existing file: %s\n", out_filename.get_ptr());
                        m_num_skipped++;
                        continue;
                    }

                    if (m_params.get_value_as_bool("timestamp"))
                    {
                        if (file_utils::is_older_than(in_filename.get_ptr(), out_filename.get_ptr()))
                        {
                            console::warning("Skipping up to date file: %s\n", out_filename.get_ptr());
                            m_num_skipped++;
                            continue;
                        }
                    }
                }
            }

            convert_status status = cCSFailed;

            if (info_mode)
            {
                status = display_file_info(file_index, files.size(), in_filename.get_ptr());
            }
            else if (compare_mode)
            {
                status = compare_file(file_index, files.size(), in_filename.get_ptr(), out_filename.get_ptr(), out_file_type);
            }
            else if (read_only_file_check(out_filename.get_ptr()))
            {
                status = convert_file(file_index, files.size(), in_filename.get_ptr(), out_filename.get_ptr(), out_file_type);
            }

            m_num_processed++;

            switch (status)
            {
                case cCSSucceeded: {
                    console::info("");
                    m_num_succeeded++;
                    break;
                }
                case cCSSkipped: {
                    console::info("Skipping file.\n");
                    m_num_skipped++;
                    break;
                }
                case cCSBadParam: {
                    return false;
                }
                default: {
                    if (!m_params.get_value_as_bool("ignoreerrors"))
                        return false;

                    console::info("");

                    m_num_failed++;
                    break;
                }
            }
        }

        return true;
    }